

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O2

void __thiscall
vkt::rasterization::anon_unknown_0::BaseRenderingTestInstance::BaseRenderingTestInstance
          (BaseRenderingTestInstance *this,Context *context,VkSampleCountFlagBits sampleCount,
          deUint32 renderSize)

{
  Move<vk::Handle<(vk::HandleType)9>_> *this_00;
  Move<vk::Handle<(vk::HandleType)9>_> *this_01;
  Move<vk::Handle<(vk::HandleType)13>_> *this_02;
  Move<vk::Handle<(vk::HandleType)21>_> *this_03;
  Move<vk::Handle<(vk::HandleType)22>_> *this_04;
  Move<vk::Handle<(vk::HandleType)19>_> *this_05;
  Move<vk::Handle<(vk::HandleType)8>_> *this_06;
  Move<vk::Handle<(vk::HandleType)16>_> *this_07;
  Move<vk::Handle<(vk::HandleType)8>_> *this_08;
  void **ppvVar1;
  deUint64 dVar2;
  Allocation *pAVar3;
  ProgramCollection<vk::ProgramBinary> *pPVar4;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_01;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_02;
  VkDevice pVVar5;
  VkAllocationCallbacks *pVVar6;
  int iVar7;
  VkResult VVar8;
  VkPhysicalDeviceProperties *pVVar9;
  TextureFormat TVar10;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *pAVar11;
  InstanceInterface *pIVar12;
  VkPhysicalDevice pVVar13;
  ProgramBinary *pPVar14;
  MessageBuilder *pMVar15;
  NotSupportedError *pNVar16;
  bool bVar17;
  undefined4 uVar18;
  undefined4 in_stack_fffffffffffffc3c;
  VkImageFormatProperties *pVVar19;
  VkImageFormatProperties *this_09;
  deUint32 queueFamilyIndex;
  VkSubpassDescription subpassDesc;
  VkImageFormatProperties properties;
  VkImageView attachments [2];
  VkAttachmentReference *local_308;
  VkAllocationCallbacks *pVStack_300;
  RefBase<vk::Handle<(vk::HandleType)17>_> local_248;
  DescriptorPoolBuilder descriptorPoolBuilder;
  VkAttachmentReference resolveAttachmentRef;
  VkAttachmentReference attachmentRef;
  VkFramebufferCreateInfo framebufferCreateInfo;
  DescriptorSetLayoutBuilder descriptorSetLayoutBuilder;
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__BaseRenderingTestInstance_00bdc1e8;
  this->m_renderSize = renderSize;
  this->m_sampleCount = sampleCount;
  pVVar9 = Context::getDeviceProperties(context);
  this->m_subpixelBits = (pVVar9->limits).subPixelPrecisionBits;
  this->m_multisampling = (uint)(this->m_sampleCount != VK_SAMPLE_COUNT_1_BIT);
  this->m_imageFormat = VK_FORMAT_R8G8B8A8_UNORM;
  TVar10 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  this->m_textureFormat = TVar10;
  this_00 = &this->m_image;
  this_01 = &this->m_resolvedImage;
  this_02 = &this->m_resolvedImageView;
  this_03 = &this->m_descriptorPool;
  this_04 = &this->m_descriptorSet;
  this_05 = &this->m_descriptorSetLayout;
  this_06 = &this->m_uniformBuffer;
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_imageMemory).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
  .ptr = (Allocation *)0x0;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0
  ;
  (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_resolvedImageMemory).
  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)0x0;
  memset(this_02,0,0xe8);
  this->m_uniformBufferSize = 4;
  this_07 = &this->m_pipelineLayout;
  this_08 = &this->m_resultBuffer;
  memset(this_07,0,0xa8);
  iVar7 = tcu::TextureFormat::getPixelSize(&this->m_textureFormat);
  this->m_resultBufferSize = (ulong)(renderSize * renderSize * iVar7);
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  pAVar11 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder(&descriptorPoolBuilder);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&descriptorSetLayoutBuilder);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&subpassDesc,vk,device,2,queueFamilyIndex,
             (VkAllocationCallbacks *)0x0);
  framebufferCreateInfo.flags = (VkFramebufferCreateFlags)subpassDesc.pInputAttachments;
  framebufferCreateInfo._20_4_ = SUB84((ulong)subpassDesc.pInputAttachments >> 0x20,0);
  framebufferCreateInfo.renderPass.m_internal._0_4_ = subpassDesc.colorAttachmentCount;
  framebufferCreateInfo.renderPass.m_internal._4_4_ = subpassDesc._28_4_;
  framebufferCreateInfo.sType = subpassDesc.flags;
  framebufferCreateInfo._4_4_ = subpassDesc.pipelineBindPoint;
  framebufferCreateInfo.pNext._0_4_ = subpassDesc.inputAttachmentCount;
  framebufferCreateInfo.pNext._4_4_ = subpassDesc._12_4_;
  subpassDesc.flags = 0;
  subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
  subpassDesc.inputAttachmentCount = 0;
  subpassDesc._12_4_ = 0;
  subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
  subpassDesc.colorAttachmentCount = 0;
  subpassDesc._28_4_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::reset
            (&(this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)CONCAT44(framebufferCreateInfo._20_4_,framebufferCreateInfo.flags);
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(framebufferCreateInfo.renderPass.m_internal._4_4_,
                (VkFormat)framebufferCreateInfo.renderPass.m_internal);
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
       framebufferCreateInfo._0_8_;
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)
         CONCAT44(framebufferCreateInfo.pNext._4_4_,
                  (VkSampleCountFlagBits)framebufferCreateInfo.pNext);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&subpassDesc);
  pIVar12 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  pVVar13 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  pVVar19 = &properties;
  uVar18 = 0;
  iVar7 = (*pIVar12->_vptr_InstanceInterface[4])
                    (pIVar12,pVVar13,(ulong)this->m_imageFormat,1,0,0x11);
  if (iVar7 == -0xb) {
    pNVar16 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar16,"Format not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
               ,0xeb);
  }
  else {
    framebufferCreateInfo.width = this->m_sampleCount;
    if ((framebufferCreateInfo.width & ~properties.sampleCounts) == 0) {
      framebufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
      framebufferCreateInfo.pNext._0_4_ = 0;
      framebufferCreateInfo.pNext._4_4_ = 0;
      framebufferCreateInfo.flags = 0;
      framebufferCreateInfo._20_4_ = 1;
      framebufferCreateInfo.renderPass.m_internal._0_4_ = this->m_imageFormat;
      framebufferCreateInfo.renderPass.m_internal._4_4_ = this->m_renderSize;
      framebufferCreateInfo._36_4_ = 1;
      framebufferCreateInfo.pAttachments._0_4_ = 1;
      framebufferCreateInfo.pAttachments._4_4_ = 1;
      framebufferCreateInfo.height = 0;
      framebufferCreateInfo.layers = 0x11;
      framebufferCreateInfo._60_4_ = 0;
      framebufferCreateInfo.attachmentCount = framebufferCreateInfo.renderPass.m_internal._4_4_;
      ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)attachments,vk,device,
                        (VkImageCreateInfo *)&framebufferCreateInfo,(VkAllocationCallbacks *)0x0);
      subpassDesc.pInputAttachments = local_308;
      subpassDesc._24_8_ = pVStack_300;
      subpassDesc.flags = (undefined4)attachments[0].m_internal;
      subpassDesc.pipelineBindPoint = attachments[0].m_internal._4_4_;
      subpassDesc._8_8_ = attachments[1].m_internal;
      attachments[0].m_internal = 0;
      attachments[1].m_internal = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset
                (&this_00->super_RefBase<vk::Handle<(vk::HandleType)9>_>);
      (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
           (VkDevice)subpassDesc.pInputAttachments;
      (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)subpassDesc._24_8_;
      (this_00->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
           subpassDesc._0_8_;
      (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)subpassDesc._8_8_;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)9>_> *)attachments);
      ::vk::getImageMemoryRequirements
                ((VkMemoryRequirements *)&subpassDesc,vk,device,
                 (VkImage)(this_00->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                          m_internal);
      (*pAVar11->_vptr_Allocator[3])(attachments,pAVar11,&subpassDesc,0);
      attachments[0].m_internal = 0;
      data.ptr._4_4_ = in_stack_fffffffffffffc3c;
      data.ptr._0_4_ = uVar18;
      data._8_8_ = pVVar19;
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
                (&(this->m_imageMemory).
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,data);
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)attachments);
      VVar8 = (*vk->_vptr_DeviceInterface[0xd])
                        (vk,device,
                         (this_00->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                         m_internal,
                         (((this->m_imageMemory).
                           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                           m_data.ptr)->m_memory).m_internal);
      ::vk::checkResult(VVar8,
                        "vkd.bindImageMemory(vkDevice, *m_image, m_imageMemory->getMemory(), m_imageMemory->getOffset())"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                        ,0x109);
      framebufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
      framebufferCreateInfo.pNext._0_4_ = 0;
      framebufferCreateInfo.pNext._4_4_ = 0;
      framebufferCreateInfo.flags = 0;
      dVar2 = (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
      ;
      framebufferCreateInfo.renderPass.m_internal._0_4_ = (VkFormat)dVar2;
      framebufferCreateInfo.renderPass.m_internal._4_4_ = (deUint32)(dVar2 >> 0x20);
      framebufferCreateInfo.attachmentCount = 1;
      framebufferCreateInfo._36_4_ = this->m_imageFormat;
      framebufferCreateInfo.pAttachments._0_4_ = 3;
      framebufferCreateInfo.pAttachments._4_4_ = 4;
      framebufferCreateInfo.width = 5;
      framebufferCreateInfo.height = 6;
      framebufferCreateInfo.layers = 1;
      framebufferCreateInfo._60_4_ = 0;
      ::vk::createImageView
                ((Move<vk::Handle<(vk::HandleType)13>_> *)&properties,vk,device,
                 (VkImageViewCreateInfo *)&framebufferCreateInfo,(VkAllocationCallbacks *)0x0);
      subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
      subpassDesc._24_8_ = properties.maxResourceSize;
      subpassDesc.flags = properties.maxExtent.width;
      subpassDesc.pipelineBindPoint = properties.maxExtent.height;
      subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
      subpassDesc._12_4_ = properties.maxMipLevels;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0;
      properties.sampleCounts = 0;
      properties.maxResourceSize = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
                (&(this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>);
      (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
           (VkDevice)subpassDesc.pInputAttachments;
      (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator
           = (VkAllocationCallbacks *)subpassDesc._24_8_;
      (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal =
           subpassDesc._0_8_;
      (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
      this_09 = &properties;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)13>_> *)this_09);
      if (this->m_multisampling == 0) {
        bVar17 = true;
      }
      else {
        pIVar12 = Context::getInstanceInterface((this->super_TestInstance).m_context);
        pVVar13 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
        uVar18 = 0;
        iVar7 = (*pIVar12->_vptr_InstanceInterface[4])
                          (pIVar12,pVVar13,(ulong)this->m_imageFormat,1,0,0x13);
        if (iVar7 == -0xb) {
          pNVar16 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    (pNVar16,"Format not supported",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                     ,0x132);
          __cxa_throw(pNVar16,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
        framebufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
        framebufferCreateInfo.pNext._0_4_ = 0;
        framebufferCreateInfo.pNext._4_4_ = 0;
        framebufferCreateInfo.flags = 0;
        framebufferCreateInfo._20_4_ = 1;
        framebufferCreateInfo.renderPass.m_internal._0_4_ = this->m_imageFormat;
        framebufferCreateInfo.renderPass.m_internal._4_4_ = this->m_renderSize;
        framebufferCreateInfo._36_4_ = 1;
        framebufferCreateInfo.pAttachments._0_4_ = 1;
        framebufferCreateInfo.pAttachments._4_4_ = 1;
        framebufferCreateInfo.width = 1;
        framebufferCreateInfo.height = 0;
        framebufferCreateInfo.layers = 0x13;
        framebufferCreateInfo._60_4_ = 0;
        framebufferCreateInfo.attachmentCount = framebufferCreateInfo.renderPass.m_internal._4_4_;
        ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)attachments,vk,device,
                          (VkImageCreateInfo *)&framebufferCreateInfo,(VkAllocationCallbacks *)0x0);
        subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
        subpassDesc.colorAttachmentCount = 0;
        subpassDesc._28_4_ = 0;
        subpassDesc.flags = (undefined4)attachments[0].m_internal;
        subpassDesc.pipelineBindPoint = attachments[0].m_internal._4_4_;
        subpassDesc._8_8_ = attachments[1].m_internal;
        attachments[0].m_internal = 0;
        attachments[1].m_internal = 0;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset
                  (&this_01->super_RefBase<vk::Handle<(vk::HandleType)9>_>);
        (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
        m_device = (VkDevice)subpassDesc.pInputAttachments;
        (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
        m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
        (this_01->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
             subpassDesc._0_8_;
        (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)9>_> *)attachments);
        ::vk::getImageMemoryRequirements
                  ((VkMemoryRequirements *)&subpassDesc,vk,device,
                   (VkImage)(this_01->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                            m_internal);
        (*pAVar11->_vptr_Allocator[3])(attachments,pAVar11,&subpassDesc,0);
        attachments[0].m_internal = 0;
        data_00.ptr._4_4_ = in_stack_fffffffffffffc3c;
        data_00.ptr._0_4_ = uVar18;
        data_00._8_8_ = this_09;
        de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
                  (&(this->m_resolvedImageMemory).
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,data_00);
        de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                  ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)attachments);
        VVar8 = (*vk->_vptr_DeviceInterface[0xd])
                          (vk,device,
                           (this_01->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                           m_internal,
                           (((this->m_resolvedImageMemory).
                             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                             m_data.ptr)->m_memory).m_internal);
        ::vk::checkResult(VVar8,
                          "vkd.bindImageMemory(vkDevice, *m_resolvedImage, m_resolvedImageMemory->getMemory(), m_resolvedImageMemory->getOffset())"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                          ,0x14a);
        framebufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
        framebufferCreateInfo.pNext._0_4_ = 0;
        framebufferCreateInfo.pNext._4_4_ = 0;
        framebufferCreateInfo.flags = 0;
        dVar2 = (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                m_internal;
        framebufferCreateInfo.renderPass.m_internal._0_4_ = (VkFormat)dVar2;
        framebufferCreateInfo.renderPass.m_internal._4_4_ = (deUint32)(dVar2 >> 0x20);
        framebufferCreateInfo.attachmentCount = 1;
        framebufferCreateInfo._36_4_ = this->m_imageFormat;
        framebufferCreateInfo.pAttachments._0_4_ = 3;
        framebufferCreateInfo.pAttachments._4_4_ = 4;
        framebufferCreateInfo.width = 5;
        framebufferCreateInfo.height = 6;
        framebufferCreateInfo.layers = 1;
        framebufferCreateInfo._60_4_ = 0;
        ::vk::createImageView
                  ((Move<vk::Handle<(vk::HandleType)13>_> *)&properties,vk,device,
                   (VkImageViewCreateInfo *)&framebufferCreateInfo,(VkAllocationCallbacks *)0x0);
        subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
        subpassDesc._24_8_ = properties.maxResourceSize;
        subpassDesc.flags = properties.maxExtent.width;
        subpassDesc.pipelineBindPoint = properties.maxExtent.height;
        subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
        subpassDesc._12_4_ = properties.maxMipLevels;
        properties.maxExtent.width = 0;
        properties.maxExtent.height = 0;
        properties.maxExtent.depth = 0;
        properties.maxMipLevels = 0;
        properties.maxArrayLayers = 0;
        properties.sampleCounts = 0;
        properties.maxResourceSize = 0;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
                  (&this_02->super_RefBase<vk::Handle<(vk::HandleType)13>_>);
        (this->m_resolvedImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
        m_device = (VkDevice)subpassDesc.pInputAttachments;
        (this->m_resolvedImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
        m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
        (this_02->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
             subpassDesc._0_8_;
        (this->m_resolvedImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&properties);
        bVar17 = this->m_multisampling == 0;
        pVVar19 = this_09;
      }
      framebufferCreateInfo.pAttachments._0_4_ = this->m_imageFormat;
      framebufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      framebufferCreateInfo.pNext._0_4_ = this->m_sampleCount;
      framebufferCreateInfo.pNext._4_4_ = 1;
      framebufferCreateInfo.flags = 0;
      framebufferCreateInfo._20_4_ = 2;
      framebufferCreateInfo.renderPass.m_internal._0_4_ = 1;
      framebufferCreateInfo.renderPass.m_internal._4_4_ = 2;
      framebufferCreateInfo.attachmentCount = 2;
      framebufferCreateInfo._36_4_ = 0;
      subpassDesc.pColorAttachments = &attachmentRef;
      subpassDesc.flags = 0;
      subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      attachmentRef.attachment = 0;
      attachmentRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
      subpassDesc._8_8_ = subpassDesc._8_8_ & 0xffffffff00000000;
      subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
      resolveAttachmentRef.attachment = 1;
      resolveAttachmentRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
      subpassDesc.colorAttachmentCount = 1;
      subpassDesc.pResolveAttachments = &resolveAttachmentRef;
      if (bVar17 != false) {
        subpassDesc.pResolveAttachments = (VkAttachmentReference *)0x0;
      }
      subpassDesc.pDepthStencilAttachment = (VkAttachmentReference *)0x0;
      subpassDesc.preserveAttachmentCount = 0;
      subpassDesc.pPreserveAttachments = (deUint32 *)0x0;
      properties.maxExtent.width = 0x26;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      framebufferCreateInfo.pAttachments._4_4_ = 1;
      framebufferCreateInfo.width = 2;
      framebufferCreateInfo.height = 0;
      framebufferCreateInfo.layers = 2;
      framebufferCreateInfo._60_4_ = 1;
      properties._16_8_ = (ulong)(2 - bVar17) << 0x20;
      properties.maxResourceSize = (VkDeviceSize)&framebufferCreateInfo;
      framebufferCreateInfo._4_4_ = (VkFormat)framebufferCreateInfo.pAttachments;
      ::vk::createRenderPass
                ((Move<vk::Handle<(vk::HandleType)17>_> *)&local_248,vk,device,
                 (VkRenderPassCreateInfo *)&properties,(VkAllocationCallbacks *)0x0);
      pVVar6 = local_248.m_data.deleter.m_allocator;
      pVVar5 = local_248.m_data.deleter.m_device;
      attachments[0].m_internal = local_248.m_data.object.m_internal;
      attachments[1].m_internal = (deUint64)local_248.m_data.deleter.m_deviceIface;
      local_248.m_data.object.m_internal = 0;
      local_248.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
      local_248.m_data.deleter.m_device = (VkDevice)0x0;
      local_248.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::reset
                (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
      (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
           pVVar5;
      (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator
           = pVVar6;
      (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
           attachments[0].m_internal;
      (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)attachments[1].m_internal;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase(&local_248);
      attachments[0].m_internal =
           (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
           m_internal;
      attachments[1].m_internal =
           (this->m_resolvedImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
           m_internal;
      framebufferCreateInfo.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
      framebufferCreateInfo.pNext._0_4_ = 0;
      framebufferCreateInfo.pNext._4_4_ = 0;
      framebufferCreateInfo.flags = 0;
      dVar2 = (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
              m_internal;
      framebufferCreateInfo.renderPass.m_internal._0_4_ = (VkFormat)dVar2;
      framebufferCreateInfo.renderPass.m_internal._4_4_ = (deUint32)(dVar2 >> 0x20);
      framebufferCreateInfo.attachmentCount = 2 - (this->m_multisampling == 0);
      framebufferCreateInfo.pAttachments = attachments;
      framebufferCreateInfo.width = this->m_renderSize;
      framebufferCreateInfo.layers = 1;
      framebufferCreateInfo.height = framebufferCreateInfo.width;
      ::vk::createFramebuffer
                ((Move<vk::Handle<(vk::HandleType)23>_> *)&properties,vk,device,
                 &framebufferCreateInfo,(VkAllocationCallbacks *)0x0);
      subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
      subpassDesc._24_8_ = properties.maxResourceSize;
      subpassDesc.flags = properties.maxExtent.width;
      subpassDesc.pipelineBindPoint = properties.maxExtent.height;
      subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
      subpassDesc._12_4_ = properties.maxMipLevels;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0;
      properties.sampleCounts = 0;
      properties.maxResourceSize = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::reset
                (&(this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>);
      (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
           (VkDevice)subpassDesc.pInputAttachments;
      (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
      (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal
           = subpassDesc._0_8_;
      (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&properties);
      framebufferCreateInfo.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
      framebufferCreateInfo.pNext._0_4_ = 0;
      framebufferCreateInfo.pNext._4_4_ = 0;
      framebufferCreateInfo.flags = 0;
      framebufferCreateInfo.renderPass.m_internal._0_4_ = (VkFormat)this->m_uniformBufferSize;
      framebufferCreateInfo.renderPass.m_internal._4_4_ =
           (deUint32)(this->m_uniformBufferSize >> 0x20);
      framebufferCreateInfo.attachmentCount = 0x10;
      framebufferCreateInfo._36_4_ = 0;
      framebufferCreateInfo.pAttachments._0_4_ = 1;
      framebufferCreateInfo._48_8_ = &queueFamilyIndex;
      ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&properties,vk,device,
                         (VkBufferCreateInfo *)&framebufferCreateInfo,(VkAllocationCallbacks *)0x0);
      subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
      subpassDesc._24_8_ = properties.maxResourceSize;
      subpassDesc.flags = properties.maxExtent.width;
      subpassDesc.pipelineBindPoint = properties.maxExtent.height;
      subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
      subpassDesc._12_4_ = properties.maxMipLevels;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0;
      properties.sampleCounts = 0;
      properties.maxResourceSize = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
                (&this_06->super_RefBase<vk::Handle<(vk::HandleType)8>_>);
      (this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device
           = (VkDevice)subpassDesc.pInputAttachments;
      (this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
      (this_06->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
           subpassDesc._0_8_;
      (this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&properties);
      ::vk::getBufferMemoryRequirements
                ((VkMemoryRequirements *)&subpassDesc,vk,device,
                 (VkBuffer)
                 (this_06->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal);
      (*pAVar11->_vptr_Allocator[3])(&properties,pAVar11,&subpassDesc,1);
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      data_01.ptr._4_4_ = in_stack_fffffffffffffc3c;
      data_01.ptr._0_4_ = uVar18;
      data_01._8_8_ = pVVar19;
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
                (&(this->m_uniformBufferMemory).
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,data_01);
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&properties);
      pAVar3 = (this->m_uniformBufferMemory).
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      VVar8 = (*vk->_vptr_DeviceInterface[0xc])
                        (vk,device,
                         (this_06->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.
                         m_internal,(pAVar3->m_memory).m_internal,pAVar3->m_offset);
      ::vk::checkResult(VVar8,
                        "vkd.bindBufferMemory(vkDevice, *m_uniformBuffer, m_uniformBufferMemory->getMemory(), m_uniformBufferMemory->getOffset())"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                        ,0x1d6);
      ::vk::DescriptorPoolBuilder::addType
                (&descriptorPoolBuilder,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1);
      ::vk::DescriptorPoolBuilder::build
                ((Move<vk::Handle<(vk::HandleType)21>_> *)&subpassDesc,&descriptorPoolBuilder,vk,
                 device,1,1);
      framebufferCreateInfo.flags = (VkFramebufferCreateFlags)subpassDesc.pInputAttachments;
      framebufferCreateInfo._20_4_ = SUB84((ulong)subpassDesc.pInputAttachments >> 0x20,0);
      framebufferCreateInfo.renderPass.m_internal._0_4_ = subpassDesc.colorAttachmentCount;
      framebufferCreateInfo.renderPass.m_internal._4_4_ = subpassDesc._28_4_;
      framebufferCreateInfo.sType = subpassDesc.flags;
      framebufferCreateInfo._4_4_ = subpassDesc.pipelineBindPoint;
      framebufferCreateInfo.pNext._0_4_ = subpassDesc.inputAttachmentCount;
      framebufferCreateInfo.pNext._4_4_ = subpassDesc._12_4_;
      subpassDesc.flags = 0;
      subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      subpassDesc.inputAttachmentCount = 0;
      subpassDesc._12_4_ = 0;
      subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
      subpassDesc.colorAttachmentCount = 0;
      subpassDesc._28_4_ = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::reset
                (&this_03->super_RefBase<vk::Handle<(vk::HandleType)21>_>);
      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
      m_device = (VkDevice)CONCAT44(framebufferCreateInfo._20_4_,framebufferCreateInfo.flags);
      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)
                    CONCAT44(framebufferCreateInfo.renderPass.m_internal._4_4_,
                             (VkFormat)framebufferCreateInfo.renderPass.m_internal);
      (this_03->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal =
           framebufferCreateInfo._0_8_;
      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
      m_deviceIface =
           (DeviceInterface *)
           CONCAT44(framebufferCreateInfo.pNext._4_4_,
                    (VkSampleCountFlagBits)framebufferCreateInfo.pNext);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&subpassDesc);
      ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                (&descriptorSetLayoutBuilder,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,0x7fffffff);
      ::vk::DescriptorSetLayoutBuilder::build
                ((Move<vk::Handle<(vk::HandleType)19>_> *)&subpassDesc,&descriptorSetLayoutBuilder,
                 vk,device,0);
      framebufferCreateInfo.flags = (VkFramebufferCreateFlags)subpassDesc.pInputAttachments;
      framebufferCreateInfo._20_4_ = SUB84((ulong)subpassDesc.pInputAttachments >> 0x20,0);
      framebufferCreateInfo.renderPass.m_internal._0_4_ = subpassDesc.colorAttachmentCount;
      framebufferCreateInfo.renderPass.m_internal._4_4_ = subpassDesc._28_4_;
      framebufferCreateInfo.sType = subpassDesc.flags;
      framebufferCreateInfo._4_4_ = subpassDesc.pipelineBindPoint;
      framebufferCreateInfo.pNext._0_4_ = subpassDesc.inputAttachmentCount;
      framebufferCreateInfo.pNext._4_4_ = subpassDesc._12_4_;
      subpassDesc.flags = 0;
      subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      subpassDesc.inputAttachmentCount = 0;
      subpassDesc._12_4_ = 0;
      subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
      subpassDesc.colorAttachmentCount = 0;
      subpassDesc._28_4_ = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::reset
                (&this_05->super_RefBase<vk::Handle<(vk::HandleType)19>_>);
      (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
      m_device = (VkDevice)CONCAT44(framebufferCreateInfo._20_4_,framebufferCreateInfo.flags);
      (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)
                    CONCAT44(framebufferCreateInfo.renderPass.m_internal._4_4_,
                             (VkFormat)framebufferCreateInfo.renderPass.m_internal);
      (this_05->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
           framebufferCreateInfo._0_8_;
      (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
      m_deviceIface =
           (DeviceInterface *)
           CONCAT44(framebufferCreateInfo.pNext._4_4_,
                    (VkSampleCountFlagBits)framebufferCreateInfo.pNext);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)19>_> *)&subpassDesc);
      subpassDesc.flags = 0x22;
      subpassDesc.inputAttachmentCount = 0;
      subpassDesc._12_4_ = 0;
      subpassDesc.pInputAttachments =
           (VkAttachmentReference *)
           (this_03->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal;
      subpassDesc.colorAttachmentCount = 1;
      subpassDesc.pColorAttachments = (VkAttachmentReference *)this_05;
      ::vk::allocateDescriptorSet
                ((Move<vk::Handle<(vk::HandleType)22>_> *)&properties,vk,device,
                 (VkDescriptorSetAllocateInfo *)&subpassDesc);
      framebufferCreateInfo.flags = properties.maxArrayLayers;
      framebufferCreateInfo._20_4_ = properties.sampleCounts;
      framebufferCreateInfo.renderPass.m_internal._0_4_ = (VkFormat)properties.maxResourceSize;
      framebufferCreateInfo.renderPass.m_internal._4_4_ =
           (deUint32)(properties.maxResourceSize >> 0x20);
      framebufferCreateInfo.sType = properties.maxExtent.width;
      framebufferCreateInfo._4_4_ = properties.maxExtent.height;
      framebufferCreateInfo.pNext._0_4_ = properties.maxExtent.depth;
      framebufferCreateInfo.pNext._4_4_ = properties.maxMipLevels;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0;
      properties.sampleCounts = 0;
      properties.maxResourceSize = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::reset
                (&this_04->super_RefBase<vk::Handle<(vk::HandleType)22>_>);
      (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device
           = (VkDevice)CONCAT44(framebufferCreateInfo._20_4_,framebufferCreateInfo.flags);
      (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
      m_internal = CONCAT44(framebufferCreateInfo.renderPass.m_internal._4_4_,
                            (VkFormat)framebufferCreateInfo.renderPass.m_internal);
      (this_04->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal =
           framebufferCreateInfo._0_8_;
      (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
      m_deviceIface =
           (DeviceInterface *)
           CONCAT44(framebufferCreateInfo.pNext._4_4_,
                    (VkSampleCountFlagBits)framebufferCreateInfo.pNext);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&properties);
      properties.maxExtent._0_8_ =
           (this_06->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0xffffffff;
      properties.sampleCounts = 0xffffffff;
      framebufferCreateInfo.sType = VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET;
      framebufferCreateInfo.pNext._0_4_ = 0;
      framebufferCreateInfo.pNext._4_4_ = 0;
      dVar2 = (this_04->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal;
      framebufferCreateInfo.flags = (VkFramebufferCreateFlags)dVar2;
      framebufferCreateInfo._20_4_ = SUB84(dVar2 >> 0x20,0);
      framebufferCreateInfo.renderPass.m_internal._0_4_ = 0;
      framebufferCreateInfo.renderPass.m_internal._4_4_ = 0;
      framebufferCreateInfo.attachmentCount = 1;
      framebufferCreateInfo._36_4_ = 6;
      framebufferCreateInfo.pAttachments._0_4_ = 0;
      framebufferCreateInfo.pAttachments._4_4_ = 0;
      framebufferCreateInfo.layers = 0;
      framebufferCreateInfo._60_4_ = 0;
      framebufferCreateInfo._48_8_ = &properties;
      (*vk->_vptr_DeviceInterface[0x3e])(vk,device,1,&framebufferCreateInfo,0,0);
      framebufferCreateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
      framebufferCreateInfo.pNext._0_4_ = 0;
      framebufferCreateInfo.pNext._4_4_ = 0;
      framebufferCreateInfo.flags = 0;
      framebufferCreateInfo._20_4_ = 1;
      framebufferCreateInfo.attachmentCount = 0;
      framebufferCreateInfo.pAttachments._0_4_ = 0;
      framebufferCreateInfo.pAttachments._4_4_ = 0;
      framebufferCreateInfo.renderPass.m_internal = (deUint64)this_05;
      ::vk::createPipelineLayout
                ((Move<vk::Handle<(vk::HandleType)16>_> *)&properties,vk,device,
                 (VkPipelineLayoutCreateInfo *)&framebufferCreateInfo,(VkAllocationCallbacks *)0x0);
      subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
      subpassDesc._24_8_ = properties.maxResourceSize;
      subpassDesc.flags = properties.maxExtent.width;
      subpassDesc.pipelineBindPoint = properties.maxExtent.height;
      subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
      subpassDesc._12_4_ = properties.maxMipLevels;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0;
      properties.sampleCounts = 0;
      properties.maxResourceSize = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::reset
                (&this_07->super_RefBase<vk::Handle<(vk::HandleType)16>_>);
      (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
      m_device = (VkDevice)subpassDesc.pInputAttachments;
      (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
      (this_07->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal =
           subpassDesc._0_8_;
      (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&properties);
      pPVar4 = ((this->super_TestInstance).m_context)->m_progCollection;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&properties,"vertext_shader",(allocator<char> *)attachments);
      pPVar14 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar4,(string *)&properties);
      ::vk::createShaderModule
                ((Move<vk::Handle<(vk::HandleType)14>_> *)&subpassDesc,vk,device,pPVar14,0);
      framebufferCreateInfo.flags = (VkFramebufferCreateFlags)subpassDesc.pInputAttachments;
      framebufferCreateInfo._20_4_ = SUB84((ulong)subpassDesc.pInputAttachments >> 0x20,0);
      framebufferCreateInfo.renderPass.m_internal._0_4_ = subpassDesc.colorAttachmentCount;
      framebufferCreateInfo.renderPass.m_internal._4_4_ = subpassDesc._28_4_;
      framebufferCreateInfo.sType = subpassDesc.flags;
      framebufferCreateInfo._4_4_ = subpassDesc.pipelineBindPoint;
      framebufferCreateInfo.pNext._0_4_ = subpassDesc.inputAttachmentCount;
      framebufferCreateInfo.pNext._4_4_ = subpassDesc._12_4_;
      subpassDesc.flags = 0;
      subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      subpassDesc.inputAttachmentCount = 0;
      subpassDesc._12_4_ = 0;
      subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
      subpassDesc.colorAttachmentCount = 0;
      subpassDesc._28_4_ = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::reset
                (&(this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>);
      (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
      m_device = (VkDevice)CONCAT44(framebufferCreateInfo._20_4_,framebufferCreateInfo.flags);
      (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)
                    CONCAT44(framebufferCreateInfo.renderPass.m_internal._4_4_,
                             (VkFormat)framebufferCreateInfo.renderPass.m_internal);
      (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
      m_internal = framebufferCreateInfo._0_8_;
      (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
      m_deviceIface =
           (DeviceInterface *)
           CONCAT44(framebufferCreateInfo.pNext._4_4_,
                    (VkSampleCountFlagBits)framebufferCreateInfo.pNext);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&subpassDesc);
      std::__cxx11::string::~string((string *)&properties);
      pPVar4 = ((this->super_TestInstance).m_context)->m_progCollection;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&properties,"fragment_shader",(allocator<char> *)attachments);
      pPVar14 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar4,(string *)&properties);
      ::vk::createShaderModule
                ((Move<vk::Handle<(vk::HandleType)14>_> *)&subpassDesc,vk,device,pPVar14,0);
      framebufferCreateInfo.flags = (VkFramebufferCreateFlags)subpassDesc.pInputAttachments;
      framebufferCreateInfo._20_4_ = SUB84((ulong)subpassDesc.pInputAttachments >> 0x20,0);
      framebufferCreateInfo.renderPass.m_internal._0_4_ = subpassDesc.colorAttachmentCount;
      framebufferCreateInfo.renderPass.m_internal._4_4_ = subpassDesc._28_4_;
      framebufferCreateInfo.sType = subpassDesc.flags;
      framebufferCreateInfo._4_4_ = subpassDesc.pipelineBindPoint;
      framebufferCreateInfo.pNext._0_4_ = subpassDesc.inputAttachmentCount;
      framebufferCreateInfo.pNext._4_4_ = subpassDesc._12_4_;
      subpassDesc.flags = 0;
      subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      subpassDesc.inputAttachmentCount = 0;
      subpassDesc._12_4_ = 0;
      subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
      subpassDesc.colorAttachmentCount = 0;
      subpassDesc._28_4_ = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::reset
                (&(this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>);
      (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
      m_device = (VkDevice)CONCAT44(framebufferCreateInfo._20_4_,framebufferCreateInfo.flags);
      (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)
                    CONCAT44(framebufferCreateInfo.renderPass.m_internal._4_4_,
                             (VkFormat)framebufferCreateInfo.renderPass.m_internal);
      (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
      m_internal = framebufferCreateInfo._0_8_;
      (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
      m_deviceIface =
           (DeviceInterface *)
           CONCAT44(framebufferCreateInfo.pNext._4_4_,
                    (VkSampleCountFlagBits)framebufferCreateInfo.pNext);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&subpassDesc);
      std::__cxx11::string::~string((string *)&properties);
      ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&subpassDesc,vk,device,0,
                        (VkAllocationCallbacks *)0x0);
      framebufferCreateInfo.flags = (VkFramebufferCreateFlags)subpassDesc.pInputAttachments;
      framebufferCreateInfo._20_4_ = SUB84((ulong)subpassDesc.pInputAttachments >> 0x20,0);
      framebufferCreateInfo.renderPass.m_internal._0_4_ = subpassDesc.colorAttachmentCount;
      framebufferCreateInfo.renderPass.m_internal._4_4_ = subpassDesc._28_4_;
      framebufferCreateInfo.sType = subpassDesc.flags;
      framebufferCreateInfo._4_4_ = subpassDesc.pipelineBindPoint;
      framebufferCreateInfo.pNext._0_4_ = subpassDesc.inputAttachmentCount;
      framebufferCreateInfo.pNext._4_4_ = subpassDesc._12_4_;
      subpassDesc.flags = 0;
      subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      subpassDesc.inputAttachmentCount = 0;
      subpassDesc._12_4_ = 0;
      subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
      subpassDesc.colorAttachmentCount = 0;
      subpassDesc._28_4_ = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::reset
                (&(this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>);
      (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device =
           (VkDevice)CONCAT44(framebufferCreateInfo._20_4_,framebufferCreateInfo.flags);
      (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)
           CONCAT44(framebufferCreateInfo.renderPass.m_internal._4_4_,
                    (VkFormat)framebufferCreateInfo.renderPass.m_internal);
      (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal =
           framebufferCreateInfo._0_8_;
      (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)
           CONCAT44(framebufferCreateInfo.pNext._4_4_,
                    (VkSampleCountFlagBits)framebufferCreateInfo.pNext);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)6>_> *)&subpassDesc);
      framebufferCreateInfo.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
      framebufferCreateInfo.pNext._0_4_ = 0;
      framebufferCreateInfo.pNext._4_4_ = 0;
      framebufferCreateInfo.flags = 0;
      framebufferCreateInfo.renderPass.m_internal._0_4_ = (VkFormat)this->m_resultBufferSize;
      framebufferCreateInfo.renderPass.m_internal._4_4_ =
           (deUint32)(this->m_resultBufferSize >> 0x20);
      framebufferCreateInfo.attachmentCount = 2;
      framebufferCreateInfo._36_4_ = 0;
      framebufferCreateInfo.pAttachments._0_4_ = 1;
      framebufferCreateInfo._48_8_ = &queueFamilyIndex;
      ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&properties,vk,device,
                         (VkBufferCreateInfo *)&framebufferCreateInfo,(VkAllocationCallbacks *)0x0);
      subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
      subpassDesc._24_8_ = properties.maxResourceSize;
      subpassDesc.flags = properties.maxExtent.width;
      subpassDesc.pipelineBindPoint = properties.maxExtent.height;
      subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
      subpassDesc._12_4_ = properties.maxMipLevels;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0;
      properties.sampleCounts = 0;
      properties.maxResourceSize = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
                (&this_08->super_RefBase<vk::Handle<(vk::HandleType)8>_>);
      (this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
           (VkDevice)subpassDesc.pInputAttachments;
      (this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
      (this_08->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
           subpassDesc._0_8_;
      (this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&properties);
      ::vk::getBufferMemoryRequirements
                ((VkMemoryRequirements *)&subpassDesc,vk,device,
                 (VkBuffer)
                 (this_08->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal);
      (*pAVar11->_vptr_Allocator[3])(&properties,pAVar11,&subpassDesc,1);
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      data_02.ptr._4_4_ = in_stack_fffffffffffffc3c;
      data_02.ptr._0_4_ = uVar18;
      data_02._8_8_ = pVVar19;
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
                (&(this->m_resultBufferMemory).
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,data_02);
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&properties);
      pAVar3 = (this->m_resultBufferMemory).
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      VVar8 = (*vk->_vptr_DeviceInterface[0xc])
                        (vk,device,
                         (this_08->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.
                         m_internal,(pAVar3->m_memory).m_internal,pAVar3->m_offset);
      ::vk::checkResult(VVar8,
                        "vkd.bindBufferMemory(vkDevice, *m_resultBuffer, m_resultBufferMemory->getMemory(), m_resultBufferMemory->getOffset())"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                        ,0x22e);
      framebufferCreateInfo._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
      ppvVar1 = &framebufferCreateInfo.pNext;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
      std::operator<<((ostream *)ppvVar1,"Sample count = ");
      ::vk::getSampleCountFlagsStr((Bitfield<32UL> *)&subpassDesc,this->m_sampleCount);
      pMVar15 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&framebufferCreateInfo,(Bitfield<32UL> *)&subpassDesc);
      tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar1);
      framebufferCreateInfo._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
      ppvVar1 = &framebufferCreateInfo.pNext;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
      std::operator<<((ostream *)ppvVar1,"SUBPIXEL_BITS = ");
      pMVar15 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&framebufferCreateInfo,&this->m_subpixelBits);
      tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar1);
      ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder(&descriptorSetLayoutBuilder);
      std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
      ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                     *)&descriptorPoolBuilder);
      return;
    }
    pNVar16 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar16,"Format not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
               ,0xf0);
  }
  __cxa_throw(pNVar16,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

BaseRenderingTestInstance::BaseRenderingTestInstance (Context& context, VkSampleCountFlagBits sampleCount, deUint32 renderSize)
	: TestInstance			(context)
	, m_renderSize			(renderSize)
	, m_sampleCount			(sampleCount)
	, m_subpixelBits		(context.getDeviceProperties().limits.subPixelPrecisionBits)
	, m_multisampling		(m_sampleCount != VK_SAMPLE_COUNT_1_BIT)
	, m_imageFormat			(VK_FORMAT_R8G8B8A8_UNORM)
	, m_textureFormat		(vk::mapVkFormat(m_imageFormat))
	, m_uniformBufferSize	(sizeof(float))
	, m_resultBufferSize	(renderSize * renderSize * m_textureFormat.getPixelSize())
{
	const DeviceInterface&						vkd						= m_context.getDeviceInterface();
	const VkDevice								vkDevice				= m_context.getDevice();
	const deUint32								queueFamilyIndex		= m_context.getUniversalQueueFamilyIndex();
	Allocator&									allocator				= m_context.getDefaultAllocator();
	DescriptorPoolBuilder						descriptorPoolBuilder;
	DescriptorSetLayoutBuilder					descriptorSetLayoutBuilder;

	// Command Pool
	m_commandPool = createCommandPool(vkd, vkDevice, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex);

	// Image
	{
		const VkImageUsageFlags	imageUsage = VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT;
		VkImageFormatProperties	properties;

		if ((m_context.getInstanceInterface().getPhysicalDeviceImageFormatProperties(m_context.getPhysicalDevice(),
																					 m_imageFormat,
																					 VK_IMAGE_TYPE_2D,
																					 VK_IMAGE_TILING_OPTIMAL,
																					 imageUsage,
																					 0,
																					 &properties) == VK_ERROR_FORMAT_NOT_SUPPORTED))
		{
			TCU_THROW(NotSupportedError, "Format not supported");
		}

		if ((properties.sampleCounts & m_sampleCount) != m_sampleCount)
		{
			TCU_THROW(NotSupportedError, "Format not supported");
		}

		const VkImageCreateInfo					imageCreateInfo			=
		{
			VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,		// VkStructureType			sType;
			DE_NULL,									// const void*				pNext;
			0u,											// VkImageCreateFlags		flags;
			VK_IMAGE_TYPE_2D,							// VkImageType				imageType;
			m_imageFormat,								// VkFormat					format;
			{ m_renderSize,	m_renderSize, 1u },			// VkExtent3D				extent;
			1u,											// deUint32					mipLevels;
			1u,											// deUint32					arrayLayers;
			m_sampleCount,								// VkSampleCountFlagBits	samples;
			VK_IMAGE_TILING_OPTIMAL,					// VkImageTiling			tiling;
			imageUsage,									// VkImageUsageFlags		usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode			sharingMode;
			1u,											// deUint32					queueFamilyIndexCount;
			&queueFamilyIndex,							// const deUint32*			pQueueFamilyIndices;
			VK_IMAGE_LAYOUT_UNDEFINED					// VkImageLayout			initialLayout;
		};

		m_image = vk::createImage(vkd, vkDevice, &imageCreateInfo, DE_NULL);

		m_imageMemory	= allocator.allocate(getImageMemoryRequirements(vkd, vkDevice, *m_image), MemoryRequirement::Any);
		VK_CHECK(vkd.bindImageMemory(vkDevice, *m_image, m_imageMemory->getMemory(), m_imageMemory->getOffset()));
	}

	// Image View
	{
		const VkImageViewCreateInfo				imageViewCreateInfo		=
		{
			VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,	// VkStructureType				sType;
			DE_NULL,									// const void*					pNext;
			0u,											// VkImageViewCreateFlags		flags;
			*m_image,									// VkImage						image;
			VK_IMAGE_VIEW_TYPE_2D,						// VkImageViewType				viewType;
			m_imageFormat,								// VkFormat						format;
			makeComponentMappingRGBA(),					// VkComponentMapping			components;
			{
				VK_IMAGE_ASPECT_COLOR_BIT,					// VkImageAspectFlags			aspectMask;
				0u,											// deUint32						baseMipLevel;
				1u,											// deUint32						mipLevels;
				0u,											// deUint32						baseArrayLayer;
				1u,											// deUint32						arraySize;
			},											// VkImageSubresourceRange		subresourceRange;
		};

		m_imageView = vk::createImageView(vkd, vkDevice, &imageViewCreateInfo, DE_NULL);
	}

	if (m_multisampling)
	{
		{
			// Resolved Image
			const VkImageUsageFlags	imageUsage = VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;
			VkImageFormatProperties	properties;

			if ((m_context.getInstanceInterface().getPhysicalDeviceImageFormatProperties(m_context.getPhysicalDevice(),
																						 m_imageFormat,
																						 VK_IMAGE_TYPE_2D,
																						 VK_IMAGE_TILING_OPTIMAL,
																						 imageUsage,
																						 0,
																						 &properties) == VK_ERROR_FORMAT_NOT_SUPPORTED))
			{
				TCU_THROW(NotSupportedError, "Format not supported");
			}

			const VkImageCreateInfo					imageCreateInfo			=
			{
				VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,		// VkStructureType			sType;
				DE_NULL,									// const void*				pNext;
				0u,											// VkImageCreateFlags		flags;
				VK_IMAGE_TYPE_2D,							// VkImageType				imageType;
				m_imageFormat,								// VkFormat					format;
				{ m_renderSize,	m_renderSize, 1u },			// VkExtent3D				extent;
				1u,											// deUint32					mipLevels;
				1u,											// deUint32					arrayLayers;
				VK_SAMPLE_COUNT_1_BIT,						// VkSampleCountFlagBits	samples;
				VK_IMAGE_TILING_OPTIMAL,					// VkImageTiling			tiling;
				imageUsage,									// VkImageUsageFlags		usage;
				VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode			sharingMode;
				1u,											// deUint32					queueFamilyIndexCount;
				&queueFamilyIndex,							// const deUint32*			pQueueFamilyIndices;
				VK_IMAGE_LAYOUT_UNDEFINED					// VkImageLayout			initialLayout;
			};

			m_resolvedImage			= vk::createImage(vkd, vkDevice, &imageCreateInfo, DE_NULL);
			m_resolvedImageMemory	= allocator.allocate(getImageMemoryRequirements(vkd, vkDevice, *m_resolvedImage), MemoryRequirement::Any);
			VK_CHECK(vkd.bindImageMemory(vkDevice, *m_resolvedImage, m_resolvedImageMemory->getMemory(), m_resolvedImageMemory->getOffset()));
		}

		// Resolved Image View
		{
			const VkImageViewCreateInfo				imageViewCreateInfo		=
			{
				VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,	// VkStructureType				sType;
				DE_NULL,									// const void*					pNext;
				0u,											// VkImageViewCreateFlags		flags;
				*m_resolvedImage,							// VkImage						image;
				VK_IMAGE_VIEW_TYPE_2D,						// VkImageViewType				viewType;
				m_imageFormat,								// VkFormat						format;
				makeComponentMappingRGBA(),					// VkComponentMapping			components;
				{
					VK_IMAGE_ASPECT_COLOR_BIT,					// VkImageAspectFlags			aspectMask;
					0u,											// deUint32						baseMipLevel;
					1u,											// deUint32						mipLevels;
					0u,											// deUint32						baseArrayLayer;
					1u,											// deUint32						arraySize;
				},											// VkImageSubresourceRange		subresourceRange;
			};

			m_resolvedImageView = vk::createImageView(vkd, vkDevice, &imageViewCreateInfo, DE_NULL);
		}

	}

	// Render Pass
	{
		const VkImageLayout						imageLayout				= VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
		const VkAttachmentDescription			attachmentDesc[]		=
		{
			{
				0u,													// VkAttachmentDescriptionFlags		flags;
				m_imageFormat,										// VkFormat							format;
				m_sampleCount,										// VkSampleCountFlagBits			samples;
				VK_ATTACHMENT_LOAD_OP_CLEAR,						// VkAttachmentLoadOp				loadOp;
				VK_ATTACHMENT_STORE_OP_STORE,						// VkAttachmentStoreOp				storeOp;
				VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// VkAttachmentLoadOp				stencilLoadOp;
				VK_ATTACHMENT_STORE_OP_DONT_CARE,					// VkAttachmentStoreOp				stencilStoreOp;
				imageLayout,										// VkImageLayout					initialLayout;
				imageLayout,										// VkImageLayout					finalLayout;
			},
			{
				0u,													// VkAttachmentDescriptionFlags		flags;
				m_imageFormat,										// VkFormat							format;
				VK_SAMPLE_COUNT_1_BIT,								// VkSampleCountFlagBits			samples;
				VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// VkAttachmentLoadOp				loadOp;
				VK_ATTACHMENT_STORE_OP_STORE,						// VkAttachmentStoreOp				storeOp;
				VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// VkAttachmentLoadOp				stencilLoadOp;
				VK_ATTACHMENT_STORE_OP_DONT_CARE,					// VkAttachmentStoreOp				stencilStoreOp;
				imageLayout,										// VkImageLayout					initialLayout;
				imageLayout,										// VkImageLayout					finalLayout;
			}
		};

		const VkAttachmentReference				attachmentRef			=
		{
			0u,													// deUint32							attachment;
			imageLayout,										// VkImageLayout					layout;
		};

		const VkAttachmentReference				resolveAttachmentRef	=
		{
			1u,													// deUint32							attachment;
			imageLayout,										// VkImageLayout					layout;
		};

		const VkSubpassDescription				subpassDesc				=
		{
			0u,													// VkSubpassDescriptionFlags		flags;
			VK_PIPELINE_BIND_POINT_GRAPHICS,					// VkPipelineBindPoint				pipelineBindPoint;
			0u,													// deUint32							inputAttachmentCount;
			DE_NULL,											// const VkAttachmentReference*		pInputAttachments;
			1u,													// deUint32							colorAttachmentCount;
			&attachmentRef,										// const VkAttachmentReference*		pColorAttachments;
			m_multisampling ? &resolveAttachmentRef : DE_NULL,	// const VkAttachmentReference*		pResolveAttachments;
			DE_NULL,											// const VkAttachmentReference*		pDepthStencilAttachment;
			0u,													// deUint32							preserveAttachmentCount;
			DE_NULL,											// const VkAttachmentReference*		pPreserveAttachments;
		};

		const VkRenderPassCreateInfo			renderPassCreateInfo	=
		{
			VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,			// VkStructureType					sType;
			DE_NULL,											// const void*						pNext;
			0u,													// VkRenderPassCreateFlags			flags;
			m_multisampling ? 2u : 1u,							// deUint32							attachmentCount;
			attachmentDesc,										// const VkAttachmentDescription*	pAttachments;
			1u,													// deUint32							subpassCount;
			&subpassDesc,										// const VkSubpassDescription*		pSubpasses;
			0u,													// deUint32							dependencyCount;
			DE_NULL,											// const VkSubpassDependency*		pDependencies;
		};

		m_renderPass =  createRenderPass(vkd, vkDevice, &renderPassCreateInfo, DE_NULL);
	}

	// FrameBuffer
	{
		const VkImageView						attachments[]			=
		{
			*m_imageView,
			*m_resolvedImageView
		};

		const VkFramebufferCreateInfo			framebufferCreateInfo	=
		{
			VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO,	// VkStructureType			sType;
			DE_NULL,									// const void*				pNext;
			0u,											// VkFramebufferCreateFlags	flags;
			*m_renderPass,								// VkRenderPass				renderPass;
			m_multisampling ? 2u : 1u,					// deUint32					attachmentCount;
			attachments,								// const VkImageView*		pAttachments;
			m_renderSize,								// deUint32					width;
			m_renderSize,								// deUint32					height;
			1u,											// deUint32					layers;
		};

		m_frameBuffer = createFramebuffer(vkd, vkDevice, &framebufferCreateInfo, DE_NULL);
	}

	// Uniform Buffer
	{
		const VkBufferCreateInfo				bufferCreateInfo		=
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			m_uniformBufferSize,						// VkDeviceSize			size;
			VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyIndexCount;
			&queueFamilyIndex							// const deUint32*		pQueueFamilyIndices;
		};

		m_uniformBuffer			= createBuffer(vkd, vkDevice, &bufferCreateInfo);
		m_uniformBufferMemory	= allocator.allocate(getBufferMemoryRequirements(vkd, vkDevice, *m_uniformBuffer), MemoryRequirement::HostVisible);

		VK_CHECK(vkd.bindBufferMemory(vkDevice, *m_uniformBuffer, m_uniformBufferMemory->getMemory(), m_uniformBufferMemory->getOffset()));
	}

	// Descriptors
	{
		descriptorPoolBuilder.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER);
		m_descriptorPool = descriptorPoolBuilder.build(vkd, vkDevice, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);

		descriptorSetLayoutBuilder.addSingleBinding(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, VK_SHADER_STAGE_ALL);
		m_descriptorSetLayout = descriptorSetLayoutBuilder.build(vkd, vkDevice);

		const VkDescriptorSetAllocateInfo		descriptorSetParams		=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
			DE_NULL,
			*m_descriptorPool,
			1u,
			&m_descriptorSetLayout.get(),
		};

		m_descriptorSet = allocateDescriptorSet(vkd, vkDevice, &descriptorSetParams);

		const VkDescriptorBufferInfo			descriptorBufferInfo	=
		{
			*m_uniformBuffer,							// VkBuffer		buffer;
			0u,											// VkDeviceSize	offset;
			VK_WHOLE_SIZE								// VkDeviceSize	range;
		};

		const VkWriteDescriptorSet				writeDescritporSet		=
		{
			VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,		// VkStructureType					sType;
			DE_NULL,									// const void*						pNext;
			*m_descriptorSet,							// VkDescriptorSet					destSet;
			0,											// deUint32							destBinding;
			0,											// deUint32							destArrayElement;
			1u,											// deUint32							count;
			VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,			// VkDescriptorType					descriptorType;
			DE_NULL,									// const VkDescriptorImageInfo*		pImageInfo;
			&descriptorBufferInfo,						// const VkDescriptorBufferInfo*	pBufferInfo;
			DE_NULL										// const VkBufferView*				pTexelBufferView;
		};

		vkd.updateDescriptorSets(vkDevice, 1u, &writeDescritporSet, 0u, DE_NULL);
	}

	// Pipeline Layout
	{
		const VkPipelineLayoutCreateInfo		pipelineLayoutCreateInfo	=
		{
			VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,		// VkStructureType				sType;
			DE_NULL,											// const void*					pNext;
			0u,													// VkPipelineLayoutCreateFlags	flags;
			1u,													// deUint32						descriptorSetCount;
			&m_descriptorSetLayout.get(),						// const VkDescriptorSetLayout*	pSetLayouts;
			0u,													// deUint32						pushConstantRangeCount;
			DE_NULL												// const VkPushConstantRange*	pPushConstantRanges;
		};

		m_pipelineLayout = createPipelineLayout(vkd, vkDevice, &pipelineLayoutCreateInfo);
	}

	// Shaders
	{
		m_vertexShaderModule	= createShaderModule(vkd, vkDevice, m_context.getBinaryCollection().get("vertext_shader"), 0);
		m_fragmentShaderModule	= createShaderModule(vkd, vkDevice, m_context.getBinaryCollection().get("fragment_shader"), 0);
	}

	// Fence
	m_fence = createFence(vkd, vkDevice);

	// Result Buffer
	{
		const VkBufferCreateInfo				bufferCreateInfo		=
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			m_resultBufferSize,							// VkDeviceSize			size;
			VK_BUFFER_USAGE_TRANSFER_DST_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyIndexCount;
			&queueFamilyIndex							// const deUint32*		pQueueFamilyIndices;
		};

		m_resultBuffer			= createBuffer(vkd, vkDevice, &bufferCreateInfo);
		m_resultBufferMemory	= allocator.allocate(getBufferMemoryRequirements(vkd, vkDevice, *m_resultBuffer), MemoryRequirement::HostVisible);

		VK_CHECK(vkd.bindBufferMemory(vkDevice, *m_resultBuffer, m_resultBufferMemory->getMemory(), m_resultBufferMemory->getOffset()));
	}

	m_context.getTestContext().getLog() << tcu::TestLog::Message << "Sample count = " << getSampleCountFlagsStr(m_sampleCount) << tcu::TestLog::EndMessage;
	m_context.getTestContext().getLog() << tcu::TestLog::Message << "SUBPIXEL_BITS = " << m_subpixelBits << tcu::TestLog::EndMessage;
}